

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  ImGuiStyleMod *pIVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  ImGuiStyleMod *__dest;
  int iVar7;
  int iVar8;
  ImGuiContext *ctx;
  
  pIVar5 = GImGui;
  if (0x18 < (uint)idx) {
    __assert_fail("idx >= 0 && idx < ImGuiStyleVar_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0xb43,"const ImGuiStyleVarInfo *GetStyleVarInfo(ImGuiStyleVar)");
  }
  if (GStyleVarInfo[(uint)idx].Count == 1) {
    uVar3 = GStyleVarInfo[(uint)idx].Offset;
    iVar2 = *(int *)((long)&(GImGui->Style).Alpha + (ulong)uVar3);
    iVar6 = (GImGui->StyleVarStack).Size;
    if (iVar6 == (GImGui->StyleVarStack).Capacity) {
      if (iVar6 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar6 / 2 + iVar6;
      }
      iVar8 = iVar6 + 1;
      if (iVar6 + 1 < iVar7) {
        iVar8 = iVar7;
      }
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      __dest = (ImGuiStyleMod *)(*GImAllocatorAllocFunc)((long)iVar8 * 0xc,GImAllocatorUserData);
      pIVar4 = (pIVar5->StyleVarStack).Data;
      if (pIVar4 != (ImGuiStyleMod *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar5->StyleVarStack).Size * 0xc);
        pIVar4 = (pIVar5->StyleVarStack).Data;
        if ((pIVar4 != (ImGuiStyleMod *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar5->StyleVarStack).Data = __dest;
      (pIVar5->StyleVarStack).Capacity = iVar8;
      iVar6 = (pIVar5->StyleVarStack).Size;
    }
    else {
      __dest = (GImGui->StyleVarStack).Data;
    }
    __dest[iVar6].VarIdx = idx;
    __dest[iVar6].field_1.BackupInt[0] = iVar2;
    (pIVar5->StyleVarStack).Size = (pIVar5->StyleVarStack).Size + 1;
    *(float *)((long)&(pIVar5->Style).Alpha + (ulong)uVar3) = val;
    return;
  }
  __assert_fail("0 && \"Called PushStyleVar() float variant but variable is not a float!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                ,0xb53,"void ImGui::PushStyleVar(ImGuiStyleVar, float)");
}

Assistant:

static const ImGuiStyleVarInfo* GetStyleVarInfo(ImGuiStyleVar idx)
{
    IM_ASSERT(idx >= 0 && idx < ImGuiStyleVar_COUNT);
    IM_ASSERT(IM_ARRAYSIZE(GStyleVarInfo) == ImGuiStyleVar_COUNT);
    return &GStyleVarInfo[idx];
}